

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_grow(mp_int *a,int size)

{
  int iVar1;
  int iVar2;
  mp_digit *pmVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = 0;
  if (a->alloc < size) {
    uVar5 = size + 0x1f;
    if (-1 < size) {
      uVar5 = size;
    }
    iVar1 = (uVar5 & 0xffffffe0) + 0x40;
    pmVar3 = (mp_digit *)realloc(a->dp,(long)iVar1 << 3);
    if (pmVar3 == (mp_digit *)0x0) {
      iVar4 = -2;
    }
    else {
      a->dp = pmVar3;
      iVar2 = a->alloc;
      a->alloc = iVar1;
      iVar4 = 0;
      if (iVar2 < iVar1) {
        iVar4 = 0;
        memset(pmVar3 + iVar2,0,(ulong)((size - (size % 0x20 + iVar2)) + 0x3f) * 8 + 8);
      }
    }
  }
  return iVar4;
}

Assistant:

int mp_grow (mp_int * a, int size)
{
  int     i;
  mp_digit *tmp;

  /* if the alloc size is smaller alloc more ram */
  if (a->alloc < size) {
    /* ensure there are always at least MP_PREC digits extra on top */
    size += (MP_PREC * 2) - (size % MP_PREC);

    /* reallocate the array a->dp
     *
     * We store the return in a temporary variable
     * in case the operation failed we don't want
     * to overwrite the dp member of a.
     */
    tmp = OPT_CAST(mp_digit) XREALLOC (a->dp, sizeof (mp_digit) * size);
    if (tmp == NULL) {
      /* reallocation failed but "a" is still valid [can be freed] */
      return MP_MEM;
    }

    /* reallocation succeeded so set a->dp */
    a->dp = tmp;

    /* zero excess digits */
    i        = a->alloc;
    a->alloc = size;
    for (; i < a->alloc; i++) {
      a->dp[i] = 0;
    }
  }
  return MP_OKAY;
}